

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhinull.cpp
# Opt level: O0

bool __thiscall QNullTexture::create(QNullTexture *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  GlobalColor *pGVar7;
  QRhiResource *in_RDI;
  long in_FS_OFFSET;
  int level;
  int layer;
  int layerCount;
  int mipLevelCount;
  bool is1D;
  bool hasMipMaps;
  bool isArray;
  bool is3D;
  bool isCube;
  QRhiNull *rhiD;
  QSize size;
  int in_stack_ffffffffffffff68;
  Flag in_stack_ffffffffffffff6c;
  GlobalColor in_stack_ffffffffffffff70;
  GlobalColor in_stack_ffffffffffffff74;
  GlobalColor GVar8;
  GlobalColor GVar9;
  int iVar10;
  array<QImage,_16UL> *this_00;
  int local_70;
  int local_6c;
  int local_24 [3];
  int local_18;
  undefined1 *local_14;
  QFlagsStorage<QRhiTexture::Flag> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((ulong)in_RDI[2]._vptr_QRhiResource & 0x100000000) != 0) {
    (*in_RDI->_vptr_QRhiResource[3])();
  }
  *(undefined1 *)((long)&in_RDI[2]._vptr_QRhiResource + 4) = 1;
  bVar1 = QFlags<QRhiTexture::Flag>::testFlag
                    ((QFlags<QRhiTexture::Flag> *)
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     in_stack_ffffffffffffff6c);
  bVar2 = QFlags<QRhiTexture::Flag>::testFlag
                    ((QFlags<QRhiTexture::Flag> *)
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     in_stack_ffffffffffffff6c);
  bVar3 = QFlags<QRhiTexture::Flag>::testFlag
                    ((QFlags<QRhiTexture::Flag> *)
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     in_stack_ffffffffffffff6c);
  bVar4 = QFlags<QRhiTexture::Flag>::testFlag
                    ((QFlags<QRhiTexture::Flag> *)
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     in_stack_ffffffffffffff6c);
  this_00 = (array<QImage,_16UL> *)&in_RDI[1].m_objectName;
  QFlags<QRhiTexture::Flag>::QFlags
            ((QFlags<QRhiTexture::Flag> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff6c
            );
  bVar5 = QFlags<QRhiTexture::Flag>::testFlags
                    ((QFlags<QRhiTexture::Flag> *)this_00,(QFlags<QRhiTexture::Flag>)local_c.i);
  local_14 = &DAT_aaaaaaaaaaaaaaaa;
  if (bVar5) {
    local_18 = 1;
    local_24[2] = QSize::width((QSize *)0x6b0a56);
    qMax<int>(&local_18,local_24 + 2);
    QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
  }
  else {
    bVar5 = QSize::isEmpty((QSize *)this_00);
    if (bVar5) {
      QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    }
    else {
      local_14 = *(undefined1 **)((long)&in_RDI[1]._vptr_QRhiResource + 4);
    }
  }
  if (bVar4) {
    iVar6 = QRhi::mipLevelsForSize
                      ((QSize *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  }
  else {
    iVar6 = 1;
  }
  iVar10 = iVar6;
  if (bVar2) {
    local_24[1] = 1;
    pGVar7 = (GlobalColor *)qMax<int>(local_24 + 1,(int *)((long)&in_RDI[1].m_rhi + 4));
    GVar8 = *pGVar7;
  }
  else if (bVar1) {
    in_stack_ffffffffffffff74 = lightGray;
    GVar8 = lightGray;
  }
  else if (bVar3) {
    local_24[0] = 0;
    pGVar7 = (GlobalColor *)qMax<int>(local_24,(int *)&in_RDI[1].m_id);
    in_stack_ffffffffffffff70 = *pGVar7;
    in_stack_ffffffffffffff74 = in_stack_ffffffffffffff70;
    GVar8 = in_stack_ffffffffffffff70;
  }
  else {
    in_stack_ffffffffffffff70 = color1;
    in_stack_ffffffffffffff74 = in_stack_ffffffffffffff70;
    GVar8 = in_stack_ffffffffffffff70;
  }
  GVar9 = GVar8;
  if (*(int *)&in_RDI[1]._vptr_QRhiResource == 1) {
    QVarLengthArray<std::array<QImage,_16UL>,_6LL>::resize
              ((QVarLengthArray<std::array<QImage,_16UL>,_6LL> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    for (local_6c = 0; local_6c < (int)GVar8; local_6c = local_6c + 1) {
      for (local_70 = 0; local_70 < iVar6; local_70 = local_70 + 1) {
        QRhi::sizeForMipLevel((int)((ulong)this_00 >> 0x20),(QSize *)CONCAT44(iVar10,GVar9));
        QImage::QImage((QImage *)this_00,(QSize *)CONCAT44(iVar10,GVar9),in_stack_ffffffffffffff74);
        QVLABase<std::array<QImage,_16UL>_>::operator[]
                  ((QVLABase<std::array<QImage,_16UL>_> *)
                   CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0x6b0c00);
        std::array<QImage,_16UL>::operator[](this_00,CONCAT44(iVar10,GVar9));
        QImage::operator=((QImage *)CONCAT44(iVar10,GVar9),
                          (QImage *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
        QImage::~QImage((QImage *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
        QVLABase<std::array<QImage,_16UL>_>::operator[]
                  ((QVLABase<std::array<QImage,_16UL>_> *)
                   CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0x6b0c37);
        std::array<QImage,_16UL>::operator[](this_00,CONCAT44(iVar10,GVar9));
        QImage::fill((QImage *)CONCAT44(iVar10,GVar9),in_stack_ffffffffffffff74);
      }
    }
  }
  *(int *)&in_RDI[0x32].m_objectName.d.ptr = *(int *)&in_RDI[0x32].m_objectName.d.ptr + 1;
  QRhiImplementation::registerResource
            ((QRhiImplementation *)CONCAT44(iVar10,GVar9),in_RDI,SUB81((ulong)this_00 >> 0x38,0));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return true;
}

Assistant:

bool QNullTexture::create()
{
    if (valid)
        destroy();

    valid = true;

    QRHI_RES_RHI(QRhiNull);
    const bool isCube = m_flags.testFlag(CubeMap);
    const bool is3D = m_flags.testFlag(ThreeDimensional);
    const bool isArray = m_flags.testFlag(TextureArray);
    const bool hasMipMaps = m_flags.testFlag(MipMapped);
    const bool is1D = m_flags.testFlags(OneDimensional);
    QSize size = is1D ? QSize(qMax(1, m_pixelSize.width()), 1)
                      : (m_pixelSize.isEmpty() ? QSize(1, 1) : m_pixelSize);
    const int mipLevelCount = hasMipMaps ? rhiD->q->mipLevelsForSize(size) : 1;
    const int layerCount = is3D ? qMax(1, m_depth)
                                : (isCube ? 6
                                          : (isArray ? qMax(0, m_arraySize)
                                                     : 1));

    if (m_format == RGBA8) {
        image.resize(layerCount);
        for (int layer = 0; layer < layerCount; ++layer) {
            for (int level = 0; level < mipLevelCount; ++level) {
                image[layer][level] = QImage(rhiD->q->sizeForMipLevel(level, size),
                                             QImage::Format_RGBA8888_Premultiplied);
                image[layer][level].fill(Qt::yellow);
            }
        }
    }

    generation += 1;

    rhiD->registerResource(this);

    return true;
}